

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

bool __thiscall Assimp::XGLImporter::ReadMesh(XGLImporter *this,TempScope *scope)

{
  aiVector3t<float> *paVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  pointer *ppuVar4;
  pointer *pppaVar5;
  element_type *peVar6;
  iterator iVar7;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  byte bVar8;
  aiVector2D aVar9;
  void *pvVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  int iVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar18;
  undefined4 extraout_var_01;
  mapped_type *pmVar19;
  mapped_type *this_00;
  aiScene *paVar20;
  undefined1 uVar21;
  ulong uVar22;
  aiVector3t<float> *__args;
  aiMesh *paVar23;
  XGLImporter *this_01;
  char cVar24;
  byte bVar25;
  undefined1 uVar26;
  byte *pbVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  aiVector3D aVar28;
  uint vcount;
  uint meshId;
  TempFace tf [3];
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  bymat;
  TempMesh t;
  uint local_1d4;
  char local_1cf [3];
  uint local_1cc;
  undefined1 local_1c8 [16];
  TempScope *local_1b8;
  undefined1 local_1b0 [32];
  vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *local_190;
  string local_188;
  undefined1 local_168 [8];
  undefined1 auStack_160 [8];
  undefined1 auStack_158 [8];
  aiVector2D aStack_150;
  undefined2 local_148;
  undefined2 uStack_146;
  TempFace TStack_144;
  double local_120;
  void *pvStack_118;
  _Alloc_hider local_110;
  aiVector2D aStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  aiScene *local_d8;
  aiScene *local_d0;
  size_t local_c8;
  TempMesh local_c0;
  
  local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.points._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = (aiScene *)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8 = 0;
  local_d0 = local_d8;
  local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.points._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1cc = ReadIDAttr(this);
  local_1b8 = scope;
  do {
    paVar23 = (aiMesh *)(local_1b0 + 0x10);
    bVar13 = ReadElementUpToClosing(this,"mesh");
    if (!bVar13) {
      if (local_d8 != (aiScene *)(local_f0 + 8)) {
        paVar20 = local_d8;
        do {
          local_168._0_4_ = paVar20->mNumMaterials;
          this_01 = (XGLImporter *)auStack_160;
          TempMaterialMesh::TempMaterialMesh
                    ((TempMaterialMesh *)auStack_160,(TempMaterialMesh *)&paVar20->mMaterials);
          local_1b0._0_8_ = ToOutputMesh(this_01,(TempMaterialMesh *)auStack_160);
          __position_01._M_current =
               (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position_01._M_current ==
              (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&scope->meshes_linear,
                       __position_01,(aiMesh **)local_1b0);
          }
          else {
            *__position_01._M_current = (aiMesh *)local_1b0._0_8_;
            pppaVar5 = &(scope->meshes_linear).
                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppaVar5 = *pppaVar5 + 1;
          }
          if (local_1cc != 0xffffffff) {
            local_188._M_dataplus._M_p._0_4_ = local_1cc;
            local_188._M_string_length = local_1b0._0_8_;
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMesh*>,std::_Select1st<std::pair<unsigned_int_const,aiMesh*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
            ::_M_emplace_equal<std::pair<unsigned_int,aiMesh*>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMesh*>,std::_Select1st<std::pair<unsigned_int_const,aiMesh*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
                        *)scope,(pair<unsigned_int,_aiMesh_*> *)&local_188);
          }
          if (pvStack_118 != (void *)0x0) {
            operator_delete(pvStack_118,(long)aStack_108 - (long)pvStack_118);
          }
          pvVar10 = (void *)CONCAT44(TStack_144.uv.x,TStack_144.normal.z);
          if (pvVar10 != (void *)0x0) {
            operator_delete(pvVar10,(long)local_120 - (long)pvVar10);
          }
          pvVar10 = (void *)CONCAT44(TStack_144.pos.x,CONCAT22(uStack_146,local_148));
          if (pvVar10 != (void *)0x0) {
            operator_delete(pvVar10,CONCAT44(TStack_144.normal.y,TStack_144.normal.x) -
                                    (long)pvVar10);
          }
          if (auStack_160 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_160,(long)aStack_150 - (long)auStack_160);
          }
          paVar20 = (aiScene *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar20);
        } while (paVar20 != (aiScene *)(local_f0 + 8));
      }
      bVar13 = local_1cc == 0xffffffff;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                   *)local_f0);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector2t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector2t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
      ::~_Rb_tree(&local_c0.uvs._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
      ::~_Rb_tree(&local_c0.normals._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                   *)&local_c0);
      return bVar13;
    }
    GetElementName_abi_cxx11_(&local_188,this);
    iVar14 = std::__cxx11::string::compare((char *)&local_188);
    if (iVar14 == 0) {
      ReadMaterial(this,scope);
    }
    else {
      iVar14 = std::__cxx11::string::compare((char *)&local_188);
      if (iVar14 == 0) {
        peVar6 = (this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar14 = (*peVar6->_vptr_IIrrXMLReader[7])(peVar6,"ID");
        if (CONCAT44(extraout_var,iVar14) == 0) goto LAB_005cbca5;
        peVar6 = (this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        fVar15 = (float)(*peVar6->_vptr_IIrrXMLReader[9])(peVar6,"ID");
        aVar28 = ReadVec3(this);
        local_1c8._8_4_ = extraout_XMM0_Dc;
        local_1c8._0_8_ = aVar28._0_8_;
        local_1c8._12_4_ = extraout_XMM0_Dd;
        local_190 = (vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)
                    CONCAT44(local_190._4_4_,aVar28.z);
        local_168._0_4_ = fVar15;
        pmVar18 = std::
                  map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                  ::operator[](&local_c0.points,(key_type *)local_168);
LAB_005cbc29:
        auVar12 = local_1c8;
        pmVar18->x = (float)local_1c8._0_4_;
        pmVar18->y = (float)local_1c8._4_4_;
        pmVar18->z = local_190._0_4_;
        scope = local_1b8;
        local_1c8 = auVar12;
      }
      else {
        iVar14 = std::__cxx11::string::compare((char *)&local_188);
        if (iVar14 == 0) {
          peVar6 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar14 = (*peVar6->_vptr_IIrrXMLReader[7])(peVar6,"ID");
          if (CONCAT44(extraout_var_00,iVar14) != 0) {
            peVar6 = (this->m_reader).
                     super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            fVar15 = (float)(*peVar6->_vptr_IIrrXMLReader[9])(peVar6,"ID");
            aVar28 = ReadVec3(this);
            local_1c8._8_4_ = extraout_XMM0_Dc_00;
            local_1c8._0_8_ = aVar28._0_8_;
            local_1c8._12_4_ = extraout_XMM0_Dd_00;
            local_190 = (vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)
                        CONCAT44(local_190._4_4_,aVar28.z);
            local_168._0_4_ = fVar15;
            pmVar18 = std::
                      map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                      ::operator[](&local_c0.normals,(key_type *)local_168);
            goto LAB_005cbc29;
          }
LAB_005cbca5:
          LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x5cbcaa);
        }
        else {
          iVar14 = std::__cxx11::string::compare((char *)&local_188);
          if (iVar14 == 0) {
            peVar6 = (this->m_reader).
                     super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar14 = (*peVar6->_vptr_IIrrXMLReader[7])(peVar6,"ID");
            if (CONCAT44(extraout_var_01,iVar14) == 0) goto LAB_005cbca5;
            peVar6 = (this->m_reader).
                     super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            fVar15 = (float)(*peVar6->_vptr_IIrrXMLReader[9])(peVar6,"ID");
            aVar9 = ReadVec2(this);
            local_1c8._8_4_ = extraout_XMM0_Dc_01;
            local_1c8._0_4_ = aVar9.x;
            local_1c8._4_4_ = aVar9.y;
            local_1c8._12_4_ = extraout_XMM0_Dd_01;
            local_168._0_4_ = fVar15;
            pmVar19 = std::
                      map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                      ::operator[](&local_c0.uvs,(key_type *)local_168);
            auVar12 = local_1c8;
            pmVar19->x = (float)local_1c8._0_4_;
            pmVar19->y = (float)local_1c8._4_4_;
            scope = local_1b8;
            local_1c8 = auVar12;
          }
          else {
            iVar14 = std::__cxx11::string::compare((char *)&local_188);
            if (((iVar14 == 0) ||
                (iVar14 = std::__cxx11::string::compare((char *)&local_188), iVar14 == 0)) ||
               (iVar14 = std::__cxx11::string::compare((char *)&local_188), iVar14 == 0)) {
              iVar14 = std::__cxx11::string::compare((char *)&local_188);
              if (iVar14 == 0) {
                local_1d4 = 3;
              }
              else {
                iVar14 = std::__cxx11::string::compare((char *)&local_188);
                local_1d4 = (iVar14 == 0) + 1;
              }
              uVar21 = 0;
              local_148._0_1_ = false;
              local_148._1_1_ = false;
              auStack_158 = (undefined1  [8])0x0;
              aStack_150.x = 0.0;
              aStack_150.y = 0.0;
              local_168._0_4_ = 0.0;
              local_168._4_4_ = 0.0;
              auStack_160 = (undefined1  [8])0x0;
              TStack_144.has_uv = false;
              TStack_144.has_normal = false;
              TStack_144.normal.y = 0.0;
              TStack_144.normal.z = 0.0;
              TStack_144.uv.x = 0.0;
              TStack_144.uv.y = 0.0;
              TStack_144.pos.x = 0.0;
              TStack_144.pos.y = 0.0;
              TStack_144.pos.z = 0.0;
              TStack_144.normal.x = 0.0;
              local_100._M_local_buf[0] = false;
              local_100._M_local_buf[1] = false;
              local_110._M_p = (pointer)0x0;
              aStack_108.x = 0.0;
              aStack_108.y = 0.0;
              local_120 = 0.0;
              pvStack_118 = (void *)0x0;
              local_1c8._0_4_ = 0xffffffff;
              uVar26 = 0;
              cVar24 = '\0';
              while (bVar13 = ReadElementUpToClosing
                                        (this,(char *)CONCAT44(local_188._M_dataplus._M_p._4_4_,
                                                               (uint)local_188._M_dataplus._M_p)),
                    bVar13) {
                GetElementName_abi_cxx11_((string *)local_1b0,this);
                iVar14 = std::__cxx11::string::compare((char *)local_1b0);
                if (((iVar14 == 0) ||
                    (iVar14 = std::__cxx11::string::compare((char *)local_1b0), iVar14 == 0)) ||
                   (iVar14 = std::__cxx11::string::compare((char *)local_1b0), iVar14 == 0)) {
                  cVar24 = '\x01';
                  ReadFaceVertex(this,&local_c0,(TempFace *)local_168);
                }
                else {
                  iVar14 = std::__cxx11::string::compare((char *)local_1b0);
                  if ((iVar14 == 0) ||
                     (iVar14 = std::__cxx11::string::compare((char *)local_1b0), iVar14 == 0)) {
                    uVar21 = 1;
                    ReadFaceVertex(this,&local_c0,&TStack_144);
                  }
                  else {
                    iVar14 = std::__cxx11::string::compare((char *)local_1b0);
                    if (iVar14 == 0) {
                      uVar26 = 1;
                      ReadFaceVertex(this,&local_c0,(TempFace *)&local_120);
                    }
                    else {
                      iVar14 = std::__cxx11::string::compare((char *)local_1b0);
                      if ((iVar14 == 0) ||
                         (iVar14 = std::__cxx11::string::compare((char *)local_1b0), iVar14 == 0)) {
                        if (local_1c8._0_4_ != -1) {
                          LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x5cbdee);
                        }
                        uVar16 = ResolveMaterialRef(this,local_1b8);
                        local_1c8._0_4_ = uVar16;
                      }
                    }
                  }
                }
                if ((aiMesh *)local_1b0._0_8_ != paVar23) {
                  operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
                }
              }
              local_1cf[2] = uVar26;
              local_1cf[1] = uVar21;
              local_1cf[0] = cVar24;
              if (local_1c8._0_4_ == -1) {
                local_1b0._0_8_ = paVar23;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b0,"missing material index","");
                LogFunctions<Assimp::XGLImporter>::ThrowException((string *)local_1b0);
                if ((aiMesh *)local_1b0._0_8_ != paVar23) {
                  operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
                }
              }
              if (local_1d4 == 0) {
                uVar16 = 0;
                bVar25 = 0;
              }
              else {
                uVar22 = 0;
                pbVar27 = (byte *)((long)&local_148 + 1);
                bVar25 = 0;
                uVar17 = 0;
                do {
                  if (local_1cf[uVar22] == '\0') {
                    local_1b0._0_8_ = local_1b0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1b0,"missing face vertex data","");
                    LogFunctions<Assimp::XGLImporter>::ThrowException((string *)local_1b0);
                    if ((aiMesh *)local_1b0._0_8_ != (aiMesh *)(local_1b0 + 0x10)) {
                      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
                    }
                  }
                  uVar16 = 1;
                  bVar8 = bVar25 & 1;
                  bVar25 = 1;
                  if (bVar8 == 0) {
                    bVar25 = *pbVar27;
                  }
                  if ((uVar17 & 1) == 0) {
                    uVar16 = (uint)pbVar27[-1];
                  }
                  uVar22 = uVar22 + 1;
                  pbVar27 = pbVar27 + 0x24;
                  uVar17 = uVar16;
                } while (uVar22 < local_1d4);
              }
              uVar11 = local_1c8._0_4_;
              if (0x3fffffff < (uint)local_1c8._0_4_) {
                LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x5cbf7c);
              }
              local_1b0._0_4_ = uVar16 << 0x1e | (uint)bVar25 << 0x1f | uVar11;
              this_00 = std::
                        map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                        ::operator[]((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                                      *)local_f0,(key_type *)local_1b0);
              this_00->matid = uVar11;
              if (local_1d4 == 0) {
                uVar17 = 0;
              }
              else {
                local_1c8._0_8_ = &this_00->normals;
                local_190 = (vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)
                            &this_00->uvs;
                __args = (aiVector3t<float> *)(auStack_160 + 4);
                uVar22 = 0;
                do {
                  paVar1 = __args + -1;
                  iVar7._M_current =
                       (this_00->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar7._M_current ==
                      (this_00->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                    _M_realloc_insert<aiVector3t<float>const&>
                              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                               this_00,iVar7,paVar1);
                  }
                  else {
                    (iVar7._M_current)->z = __args[-1].z;
                    fVar15 = paVar1->y;
                    (iVar7._M_current)->x = paVar1->x;
                    (iVar7._M_current)->y = fVar15;
                    ppaVar2 = &(this_00->positions).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar2 = *ppaVar2 + 1;
                  }
                  if (bVar25 != 0) {
                    iVar7._M_current =
                         (this_00->normals).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (this_00->normals).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                      _M_realloc_insert<aiVector3t<float>const&>
                                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                                 local_1c8._0_8_,iVar7,__args);
                    }
                    else {
                      (iVar7._M_current)->z = __args->z;
                      fVar15 = __args->y;
                      (iVar7._M_current)->x = __args->x;
                      (iVar7._M_current)->y = fVar15;
                      ppaVar2 = &(this_00->normals).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar2 = *ppaVar2 + 1;
                    }
                  }
                  if ((char)uVar16 != '\0') {
                    paVar1 = __args + 1;
                    __position._M_current =
                         (this_00->uvs).
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this_00->uvs).
                        super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
                      _M_realloc_insert<aiVector2t<float>const&>
                                (local_190,__position,(aiVector2t<float> *)paVar1);
                    }
                    else {
                      fVar15 = paVar1->y;
                      (__position._M_current)->x = paVar1->x;
                      (__position._M_current)->y = fVar15;
                      ppaVar3 = &(this_00->uvs).
                                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar3 = *ppaVar3 + 1;
                    }
                  }
                  this_00->pflags = this_00->pflags | 1 << ((char)local_1d4 - 1U & 0x1f);
                  uVar22 = uVar22 + 1;
                  __args = __args + 3;
                  uVar17 = local_1d4;
                } while (uVar22 < local_1d4);
              }
              scope = local_1b8;
              __position_00._M_current =
                   (this_00->vcounts).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (this_00->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this_00->vcounts,
                           __position_00,&local_1d4);
              }
              else {
                *__position_00._M_current = uVar17;
                ppuVar4 = &(this_00->vcounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar4 = *ppuVar4 + 1;
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint)local_188._M_dataplus._M_p) !=
        &local_188.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint)local_188._M_dataplus._M_p),
                      local_188.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

bool XGLImporter::ReadMesh(TempScope& scope)
{
    TempMesh t;

    std::map<unsigned int, TempMaterialMesh> bymat;
    const unsigned int mesh_id = ReadIDAttr();

    while (ReadElementUpToClosing("mesh"))  {
        const std::string& s = GetElementName();

        if (s == "mat") {
            ReadMaterial(scope);
        }
        else if (s == "p") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <p>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.points[id] = ReadVec3();
            }
        }
        else if (s == "n") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <n>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.normals[id] = ReadVec3();
            }
        }
        else if (s == "tc") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <tc>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.uvs[id] = ReadVec2();
            }
        }
        else if (s == "f" || s == "l" || s == "p") {
            const unsigned int vcount = s == "f" ? 3 : (s == "l" ? 2 : 1);

            unsigned int mid = ~0u;
            TempFace tf[3];
            bool has[3] = {0};

            while (ReadElementUpToClosing(s.c_str()))   {
                const std::string& s = GetElementName();
                if (s == "fv1" || s == "lv1" || s == "pv1") {
                    ReadFaceVertex(t,tf[0]);
                    has[0] = true;
                }
                else if (s == "fv2" || s == "lv2") {
                    ReadFaceVertex(t,tf[1]);
                    has[1] = true;
                }
                else if (s == "fv3") {
                    ReadFaceVertex(t,tf[2]);
                    has[2] = true;
                }
                else if (s == "mat") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
                else if (s == "matref") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
            }

            if (mid == ~0u) {
                ThrowException("missing material index");
            }

            bool nor = false;
            bool uv = false;
            for(unsigned int i = 0; i < vcount; ++i) {
                if (!has[i]) {
                    ThrowException("missing face vertex data");
                }

                nor = nor || tf[i].has_normal;
                uv = uv || tf[i].has_uv;
            }

            if (mid >= (1<<30)) {
                LogWarn("material indices exhausted, this may cause errors in the output");
            }
            unsigned int meshId = mid | ((nor?1:0)<<31) | ((uv?1:0)<<30);

            TempMaterialMesh& mesh = bymat[meshId];
            mesh.matid = mid;

            for(unsigned int i = 0; i < vcount; ++i) {
                mesh.positions.push_back(tf[i].pos);
                if(nor) {
                    mesh.normals.push_back(tf[i].normal);
                }
                if(uv) {
                    mesh.uvs.push_back(tf[i].uv);
                }

                mesh.pflags |= 1 << (vcount-1);
            }

            mesh.vcounts.push_back(vcount);
        }
    }

    // finally extract output meshes and add them to the scope
    typedef std::pair<unsigned int, TempMaterialMesh> pairt;
    for(const pairt& p : bymat) {
        aiMesh* const m  = ToOutputMesh(p.second);
        scope.meshes_linear.push_back(m);

        // if this is a definition, keep it on the stack
        if(mesh_id != ~0u) {
            scope.meshes.insert(std::pair<unsigned int, aiMesh*>(mesh_id,m));
        }
    }

    // no id == not a reference, insert this mesh right *here*
    return mesh_id == ~0u;
}